

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O1

void __thiscall
MutableS2ShapeIndex::ReserveSpace
          (MutableS2ShapeIndex *this,BatchDescriptor *batch,
          vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
          *all_edges)

{
  vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
  *pvVar1;
  pointer pRVar2;
  long lVar3;
  __uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_> _Var4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int face;
  long lVar10;
  long lVar11;
  pointer pRVar12;
  uint uVar13;
  uint uVar14;
  double dVar15;
  double dVar16;
  int face_count [6];
  int local_78 [6];
  double local_60;
  double local_58;
  double local_50;
  
  uVar6 = batch->num_edges;
  if ((int)uVar6 < 0xd556) {
    lVar10 = 0;
    do {
      std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
      reserve((vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
               *)((long)&(all_edges->
                         super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar10),(long)batch->num_edges
             );
      lVar10 = lVar10 + 0x18;
    } while (lVar10 != 0x90);
  }
  else {
    uVar13 = 1;
    if (1 < uVar6 / 10000) {
      uVar13 = uVar6 / 10000;
    }
    uVar9 = uVar13 >> 1;
    uVar6 = uVar6 + uVar9;
    local_78[0] = 0;
    local_78[1] = 0;
    local_78[2] = 0;
    local_78[3] = 0;
    local_78[4] = 0;
    local_78[5] = 0;
    pvVar1 = (this->pending_removals_)._M_t.
             super___uniq_ptr_impl<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
             .
             super__Head_base<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_false>
             ._M_head_impl;
    if (pvVar1 != (vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                   *)0x0) {
      pRVar12 = *(pointer *)
                 &(pvVar1->
                  super__Vector_base<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                  )._M_impl;
      pRVar2 = *(pointer *)
                ((long)&(pvVar1->
                        super__Vector_base<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                        )._M_impl + 8);
      if (pRVar12 != pRVar2) {
        do {
          uVar9 = (int)((ulong)((long)*(pointer *)
                                       ((long)&(pRVar12->edges).
                                               super__Vector_base<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>
                                       + 8) -
                               *(long *)&(pRVar12->edges).
                                         super__Vector_base<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>
                                         ._M_impl) >> 4) * -0x55555555 + uVar9;
          if ((int)uVar13 <= (int)uVar9) {
            lVar10 = (long)(int)uVar9;
            lVar11 = lVar10 * 0x30 + (ulong)(uVar13 << 4) * -3;
            do {
              lVar10 = lVar10 + (int)-uVar13;
              lVar3 = *(long *)&(pRVar12->edges).
                                super__Vector_base<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>.
                                _M_impl;
              dVar15 = ABS(*(double *)(lVar3 + 0x10 + lVar11));
              dVar16 = ABS(*(double *)(lVar3 + 8 + lVar11));
              uVar14 = (dVar16 <= dVar15) + 1;
              if (dVar16 < ABS(*(double *)(lVar3 + lVar11))) {
                uVar14 = (uint)(ABS(*(double *)(lVar3 + lVar11)) <= dVar15) * 2;
              }
              dVar15 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                                 ((BasicVector<Vector3,_double,_3UL> *)(lVar3 + lVar11),uVar14);
              uVar5 = uVar14 + 3;
              if (0.0 <= dVar15) {
                uVar5 = uVar14;
              }
              local_78[uVar5] = local_78[uVar5] + 1;
              uVar9 = uVar9 - uVar13;
              lVar11 = lVar11 + (ulong)(uVar13 << 4) * -3;
            } while ((long)(ulong)uVar13 <= lVar10);
          }
          pRVar12 = pRVar12 + 1;
        } while (pRVar12 != pRVar2);
      }
    }
    lVar10 = (long)this->pending_additions_begin_;
    if (this->pending_additions_begin_ < batch->additions_end) {
      do {
        _Var4._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
        super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl =
             (this->shapes_).
             super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_t.
             super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t;
        if ((_Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>)
            _Var4._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
            super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl != (S2Shape *)0x0) {
          iVar7 = (**(code **)(*(long *)_Var4._M_t.
                                        super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>
                                        .super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 0x10
                              ))(_Var4._M_t.
                                 super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                                 super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl);
          uVar9 = iVar7 + uVar9;
          while ((int)uVar13 <= (int)uVar9) {
            iVar7 = uVar9 - uVar13;
            uVar9 = uVar9 - uVar13;
            (**(code **)(*(long *)_Var4._M_t.
                                  super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                                  super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 0x18))
                      ((BasicVector<Vector3,_double,_3UL> *)&local_60,
                       _Var4._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                       super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl,iVar7);
            uVar14 = (ABS(local_58) <= ABS(local_50)) + 1;
            if (ABS(local_58) < ABS(local_60)) {
              uVar14 = (uint)(ABS(local_60) <= ABS(local_50)) * 2;
            }
            dVar15 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                               ((BasicVector<Vector3,_double,_3UL> *)&local_60,uVar14);
            uVar5 = uVar14 + 3;
            if (0.0 <= dVar15) {
              uVar5 = uVar14;
            }
            local_78[uVar5] = local_78[uVar5] + 1;
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < batch->additions_end);
    }
    lVar10 = 0;
    do {
      if (local_78[lVar10] != 0) {
        dVar15 = (double)batch->num_edges *
                 ((double)local_78[lVar10] * (1.0 / (double)(int)(uVar6 / uVar13)) + 0.02);
        uVar8 = (ulong)dVar15;
        std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
        reserve(all_edges,(long)(dVar15 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8);
      }
      lVar10 = lVar10 + 1;
      all_edges = all_edges + 1;
    } while (lVar10 != 6);
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::ReserveSpace(const BatchDescriptor& batch,
                                       vector<FaceEdge> all_edges[6]) const {
  // If the number of edges is relatively small, then the fastest approach is
  // to simply reserve space on every face for the maximum possible number of
  // edges.  We use a different threshold for this calculation than for
  // deciding when to break updates into batches, because the cost/benefit
  // ratio is different.  (Here the only extra expense is that we need to
  // sample the edges to estimate how many edges per face there are.)
  const size_t kMaxCheapBytes = 30 << 20;  // 30 MB
  const int kMaxCheapEdges = kMaxCheapBytes / (6 * sizeof(FaceEdge));
  if (batch.num_edges <= kMaxCheapEdges) {
    for (int face = 0; face < 6; ++face) {
      all_edges[face].reserve(batch.num_edges);
    }
    return;
  }
  // Otherwise we estimate the number of edges on each face by taking a random
  // sample.  The goal is to come up with an estimate that is fast and
  // accurate for non-pathological geometry.  If our estimates happen to be
  // wrong, the vector will still grow automatically - the main side effects
  // are that memory usage will be larger (by up to a factor of 3), and
  // constructing the index will be about 10% slower.
  //
  // Given a desired sample size, we choose equally spaced edges from
  // throughout the entire data set.  We use a Bresenham-type algorithm to
  // choose the samples.
  const int kDesiredSampleSize = 10000;
  const int sample_interval = max(1, batch.num_edges / kDesiredSampleSize);

  // Initialize "edge_id" to be midway through the first sample interval.
  // Because samples are equally spaced the actual sample size may differ
  // slightly from the desired sample size.
  int edge_id = sample_interval / 2;
  const int actual_sample_size = (batch.num_edges + edge_id) / sample_interval;
  int face_count[6] = { 0, 0, 0, 0, 0, 0 };
  if (pending_removals_) {
    for (const RemovedShape& removed : *pending_removals_) {
      edge_id += removed.edges.size();
      while (edge_id >= sample_interval) {
        edge_id -= sample_interval;
        face_count[S2::GetFace(removed.edges[edge_id].v0)] += 1;
      }
    }
  }
  for (int id = pending_additions_begin_; id < batch.additions_end; ++id) {
    const S2Shape* shape = this->shape(id);
    if (shape == nullptr) continue;
    edge_id += shape->num_edges();
    while (edge_id >= sample_interval) {
      edge_id -= sample_interval;
      // For speed, we only count the face containing one endpoint of the
      // edge.  In general the edge could span all 6 faces (with padding), but
      // it's not worth the expense to compute this more accurately.
      face_count[S2::GetFace(shape->edge(edge_id).v0)] += 1;
    }
  }
  // Now given the raw face counts, compute a confidence interval such that we
  // will be unlikely to allocate too little space.  Computing accurate
  // binomial confidence intervals is expensive and not really necessary.
  // Instead we use a simple approximation:
  //  - For any face with at least 1 sample, we use at least a 4-sigma
  //    confidence interval.  (The chosen width is adequate for the worst case
  //    accuracy, which occurs when the face contains approximately 50% of the
  //    edges.)  Assuming that our sample is representative, the probability of
  //    reserving too little space is approximately 1 in 30,000.
  //  - For faces with no samples at all, we don't bother reserving space.
  //    It is quite likely that such faces are truly empty, so we save time
  //    and memory this way.  If the face does contain some edges, there will
  //    only be a few so it is fine to let the vector grow automatically.
  // On average, we reserve 2% extra space for each face that has geometry.

  // kMaxSemiWidth is the maximum semi-width over all probabilities p of a
  // 4-sigma binomial confidence interval with a sample size of 10,000.
  const double kMaxSemiWidth = 0.02;
  const double sample_ratio = 1.0 / actual_sample_size;
  for (int face = 0; face < 6; ++face) {
    if (face_count[face] == 0) continue;
    double fraction = sample_ratio * face_count[face] + kMaxSemiWidth;
    all_edges[face].reserve(fraction * batch.num_edges);
  }
}